

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O1

void sha1_hash(uchar *data,unsigned_long len,sha1_ctx *ctx)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  
  uVar3 = (int)len + ctx->count[0];
  uVar1 = ctx->count[0] & 0x3f;
  __n = 0x40 - (ulong)uVar1;
  ctx->count[0] = uVar3;
  if (uVar3 < len) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  uVar4 = (ulong)uVar1;
  uVar5 = uVar4;
  if (__n <= len) {
    do {
      memcpy((void *)((long)ctx->wbuf + uVar4),data,__n);
      data = data + __n;
      lVar2 = 0x16;
      do {
        uVar1 = ctx->count[lVar2];
        ctx->count[lVar2] =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 6);
      len = len - __n;
      sha1_compile(ctx);
      __n = 0x40;
      uVar4 = 0;
      uVar5 = 0;
    } while (0x3f < len);
  }
  memcpy((void *)((long)ctx->wbuf + uVar5),data,len);
  return;
}

Assistant:

VOID_RETURN sha1_hash(const unsigned char data[], unsigned long len, sha1_ctx ctx[1])
{   uint_32t pos = (uint_32t)(ctx->count[0] & SHA1_MASK),
            space = SHA1_BLOCK_SIZE - pos;
    const unsigned char *sp = data;

    if((ctx->count[0] += len) < len)
        ++(ctx->count[1]);

    while(len >= space)     /* tranfer whole blocks if possible  */
    {
        memcpy(((unsigned char*)ctx->wbuf) + pos, sp, space);
        sp += space; len -= space; space = SHA1_BLOCK_SIZE; pos = 0;
        bsw_32(ctx->wbuf, SHA1_BLOCK_SIZE >> 2);
        sha1_compile(ctx);
    }

    memcpy(((unsigned char*)ctx->wbuf) + pos, sp, len);
}